

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRExpression * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::allocate<spirv_cross::SPIRExpression&>
          (ObjectPool<spirv_cross::SPIRExpression> *this,SPIRExpression *p)

{
  Vector<spirv_cross::SPIRExpression_*> *this_00;
  size_t sVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ID IVar6;
  _Tuple_impl<0UL,_spirv_cross::SPIRExpression_*,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>
  _Var7;
  _Head_base<0UL,_spirv_cross::SPIRExpression_*,_false> _Var8;
  ulong count;
  SPIRExpression *pSVar9;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>)malloc(count * 0xf0);
    if (_Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl !=
        (SPIRExpression *)0x0) {
      SmallVector<spirv_cross::SPIRExpression_*,_0UL>::reserve(this_00,count);
      _Var8._M_head_impl =
           (SPIRExpression *)
           _Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<spirv_cross::SPIRExpression_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.
                           buffer_size + 1);
        sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.ptr[sVar1] =
             _Var8._M_head_impl;
        (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size = sVar1 + 1;
        _Var8._M_head_impl = _Var8._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRExpression_*,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false> =
           _Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var7.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl !=
          (SPIRExpression *)0x0) goto LAB_00191f30;
    }
    pSVar9 = (SPIRExpression *)0x0;
  }
  else {
LAB_00191f30:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size;
    pSVar9 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRExpression_*,_0UL>::resize(this_00,sVar1 - 1);
    }
    (pSVar9->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_00360178;
    (pSVar9->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar9->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRExpression_003601e0;
    *(undefined4 *)&(pSVar9->super_IVariant).field_0xc =
         *(undefined4 *)&(p->super_IVariant).field_0xc;
    (pSVar9->expression)._M_dataplus._M_p = (pointer)&(pSVar9->expression).field_2;
    pcVar2 = (p->expression)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar9->expression,pcVar2,pcVar2 + (p->expression)._M_string_length);
    bVar3 = p->need_transpose;
    bVar4 = p->access_chain;
    bVar5 = p->access_meshlet_position_y;
    pSVar9->immutable = p->immutable;
    pSVar9->need_transpose = bVar3;
    pSVar9->access_chain = bVar4;
    pSVar9->access_meshlet_position_y = bVar5;
    IVar6.id = (p->loaded_from).id;
    pSVar9->expression_type = (TypeID)(p->expression_type).id;
    pSVar9->loaded_from = (ID)IVar6.id;
    (pSVar9->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
    .ptr = (TypedID<(spirv_cross::Types)0> *)0x0;
    (pSVar9->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
    .buffer_size = 0;
    (pSVar9->expression_dependencies).buffer_capacity = 0;
    (pSVar9->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
    .ptr = (TypedID<(spirv_cross::Types)0> *)&(pSVar9->expression_dependencies).stack_storage;
    (pSVar9->expression_dependencies).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&pSVar9->expression_dependencies,&p->expression_dependencies);
    (pSVar9->invariance_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
    .ptr = (TypedID<(spirv_cross::Types)0> *)0x0;
    (pSVar9->invariance_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
    .buffer_size = 0;
    (pSVar9->invariance_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
    .ptr = (TypedID<(spirv_cross::Types)0> *)&(pSVar9->invariance_dependencies).stack_storage;
    (pSVar9->invariance_dependencies).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&pSVar9->invariance_dependencies,&p->invariance_dependencies);
    (pSVar9->implied_read_expressions).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)0x0;
    (pSVar9->implied_read_expressions).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
    (pSVar9->implied_read_expressions).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar9->implied_read_expressions).stack_storage;
    (pSVar9->implied_read_expressions).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&pSVar9->implied_read_expressions,&p->implied_read_expressions);
    pSVar9->emitted_loop_level = p->emitted_loop_level;
  }
  return pSVar9;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}